

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O3

PCMSegment *
Storage::Encodings::AppleGCR::five_and_three_data
          (PCMSegment *__return_storage_ptr__,uint8_t *source)

{
  uint8_t *source_00;
  long lVar1;
  value_type_conflict3 *__val;
  
  source_00 = (uint8_t *)operator_new(0x1a1);
  memset(source_00 + 3,0,0x19d);
  source_00[0] = 0xd5;
  source_00[1] = 0xaa;
  source_00[2] = 0xad;
  source_00[0x19e] = 0xde;
  source_00[0x19b] = 0xaa;
  source_00[0x1a0] = 0xeb;
  lVar1 = 3;
  do {
    source_00[lVar1] = (anonymous_namespace)::five_and_three_mapping[source_00[lVar1]];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x19d);
  Disk::PCMSegment::PCMSegment(__return_storage_ptr__,0xd08,source_00);
  operator_delete(source_00,0x1a1);
  return __return_storage_ptr__;
}

Assistant:

Storage::Disk::PCMSegment AppleGCR::five_and_three_data(const uint8_t *source) {
	std::vector<uint8_t> data(410 + 7);

	data[0] = data_prologue[0];
	data[1] = data_prologue[1];
	data[2] = data_prologue[2];

	data[414] = epilogue[0];
	data[411] = epilogue[1];
	data[416] = epilogue[2];

	// TODO: encode.
	(void)source;

//	std::size_t source_pointer = 0;
//	std::size_t destination_pointer = 3;
//	while(source_pointer < 255) {
//		encode_five_and_three_block(&segment.data[destination_pointer], &source[source_pointer]);
//
//		source_pointer += 5;
//		destination_pointer += 8;
//	}

	// Map five-bit values up to full bytes.
	for(std::size_t c = 0; c < 410; ++c) {
		data[3 + c] = five_and_three_mapping[data[3 + c]];
	}

	return Storage::Disk::PCMSegment(data);
}